

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparator.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_2::BytewiseComparatorImpl::FindShortestSeparator
          (BytewiseComparatorImpl *this,string *start,Slice *limit)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  unsigned_long *puVar6;
  char *pcVar7;
  byte *pbVar8;
  bool bVar9;
  Slice local_58;
  byte local_41;
  ulong uStack_40;
  uint8_t diff_byte;
  size_t diff_index;
  unsigned_long local_30;
  ulong local_28;
  size_t min_length;
  Slice *limit_local;
  string *start_local;
  BytewiseComparatorImpl *this_local;
  
  min_length = (size_t)limit;
  limit_local = (Slice *)start;
  start_local = (string *)this;
  local_30 = std::__cxx11::string::size();
  diff_index = Slice::size((Slice *)min_length);
  puVar6 = std::min<unsigned_long>(&local_30,&diff_index);
  local_28 = *puVar6;
  uStack_40 = 0;
  while( true ) {
    bVar9 = false;
    if (uStack_40 < local_28) {
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)limit_local);
      cVar1 = *pcVar7;
      cVar2 = Slice::operator[]((Slice *)min_length,uStack_40);
      bVar9 = cVar1 == cVar2;
    }
    if (!bVar9) break;
    uStack_40 = uStack_40 + 1;
  }
  if (uStack_40 < local_28) {
    pbVar8 = (byte *)std::__cxx11::string::operator[]((ulong)limit_local);
    local_41 = *pbVar8;
    if ((local_41 != 0xff) &&
       (uVar4 = (uint)local_41, bVar3 = Slice::operator[]((Slice *)min_length,uStack_40),
       uVar4 + 1 < (uint)bVar3)) {
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)limit_local);
      *pcVar7 = *pcVar7 + '\x01';
      std::__cxx11::string::resize((ulong)limit_local);
      Slice::Slice(&local_58,(string *)limit_local);
      iVar5 = (*(this->super_Comparator)._vptr_Comparator[2])(this,&local_58,min_length);
      if (-1 < iVar5) {
        __assert_fail("Compare(*start, limit) < 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/comparator.cc"
                      ,0x31,
                      "virtual void leveldb::(anonymous namespace)::BytewiseComparatorImpl::FindShortestSeparator(std::string *, const Slice &) const"
                     );
      }
    }
  }
  return;
}

Assistant:

void FindShortestSeparator(std::string* start,
                             const Slice& limit) const override {
    // Find length of common prefix
    size_t min_length = std::min(start->size(), limit.size());
    size_t diff_index = 0;
    while ((diff_index < min_length) &&
           ((*start)[diff_index] == limit[diff_index])) {
      diff_index++;
    }

    if (diff_index >= min_length) {
      // Do not shorten if one string is a prefix of the other
    } else {
      uint8_t diff_byte = static_cast<uint8_t>((*start)[diff_index]);
      if (diff_byte < static_cast<uint8_t>(0xff) &&
          diff_byte + 1 < static_cast<uint8_t>(limit[diff_index])) {
        (*start)[diff_index]++;
        start->resize(diff_index + 1);
        assert(Compare(*start, limit) < 0);
      }
    }
  }